

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall V2Transport::ProcessReceivedKeyBytes(V2Transport *this)

{
  byte *pbVar1;
  pointer puVar2;
  pointer puVar3;
  undefined8 uVar4;
  Span<std::byte> output;
  bool bVar5;
  ulong uVar6;
  Logger *this_00;
  long in_FS_OFFSET;
  Span<const_std::byte> ellswift_00;
  Span<const_unsigned_char> s;
  Span<const_std::byte> aad;
  string_view logging_function;
  string_view source_file;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock46;
  EllSwiftPubKey ellswift;
  unique_lock<std::mutex> local_78;
  undefined1 local_68 [64];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar1 = (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(this->m_recv_buffer).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pbVar1;
  if (this->m_initiating == false) {
    bVar5 = true;
    if (uVar6 < 0x10) goto LAB_001a2e0d;
    if (*(undefined4 *)(pbVar1 + 0xc) == 0 && *(undefined8 *)(pbVar1 + 4) == 0x6e6f6973726576) {
      this_00 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
      if (bVar5) {
        s.m_size = 4;
        s.m_data = (this->m_recv_buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        HexStr_abi_cxx11_((string *)local_68,s);
        logging_function._M_str = "ProcessReceivedKeyBytes";
        logging_function._M_len = 0x17;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file._M_len = 0x50;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function,source_file,0x453,NET,Debug,
                   "V2 transport error: V1 peer with wrong MessageStart %s\n",(string *)local_68);
        if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
          operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        }
      }
      bVar5 = false;
      goto LAB_001a2e0d;
    }
  }
  bVar5 = true;
  if (uVar6 == 0x40) {
    ellswift_00.m_size = 0x40;
    ellswift_00.m_data = pbVar1;
    EllSwiftPubKey::EllSwiftPubKey((EllSwiftPubKey *)local_68,ellswift_00);
    local_78._M_owns = false;
    local_78._M_device = &(this->m_send_mutex).super_mutex;
    std::unique_lock<std::mutex>::lock(&local_78);
    BIP324Cipher::Initialize(&this->m_cipher,(EllSwiftPubKey *)local_68,this->m_initiating,false);
    this->m_recv_state = GARB_GARBTERM;
    puVar2 = (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar2) {
      (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar2;
    }
    this->m_send_state = READY;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_send_buffer,
               (size_type)
               ((this->m_send_buffer).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (0x10 - (long)(this->m_send_buffer).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)));
    puVar2 = (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar4 = *(undefined8 *)((this->m_cipher).m_send_garbage_terminator._M_elems + 8);
    *(undefined8 *)(puVar2 + -0x10) =
         *(undefined8 *)(this->m_cipher).m_send_garbage_terminator._M_elems;
    *(undefined8 *)(puVar2 + -8) = uVar4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_send_buffer,
               (size_type)
               ((this->m_send_buffer).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (0x14 - (long)(this->m_send_buffer).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)));
    pbVar1 = (this->m_send_garbage).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    aad.m_size = (long)(this->m_send_garbage).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pbVar1;
    output.m_size = 0x14;
    output.m_data =
         (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish + -0x14;
    aad.m_data = pbVar1;
    BIP324Cipher::Encrypt(&this->m_cipher,(Span<const_std::byte>)ZEXT816(0),aad,false,output);
    puVar2 = (this->m_send_garbage).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->m_send_garbage).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->m_send_garbage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (this->m_send_garbage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->m_send_garbage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)puVar3 - (long)puVar2);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_78);
  }
LAB_001a2e0d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool V2Transport::ProcessReceivedKeyBytes() noexcept
{
    AssertLockHeld(m_recv_mutex);
    AssertLockNotHeld(m_send_mutex);
    Assume(m_recv_state == RecvState::KEY);
    Assume(m_recv_buffer.size() <= EllSwiftPubKey::size());

    // As a special exception, if bytes 4-16 of the key on a responder connection match the
    // corresponding bytes of a V1 version message, but bytes 0-4 don't match the network magic
    // (if they did, we'd have switched to V1 state already), assume this is a peer from
    // another network, and disconnect them. They will almost certainly disconnect us too when
    // they receive our uniformly random key and garbage, but detecting this case specially
    // means we can log it.
    static constexpr std::array<uint8_t, 12> MATCH = {'v', 'e', 'r', 's', 'i', 'o', 'n', 0, 0, 0, 0, 0};
    static constexpr size_t OFFSET = std::tuple_size_v<MessageStartChars>;
    if (!m_initiating && m_recv_buffer.size() >= OFFSET + MATCH.size()) {
        if (std::equal(MATCH.begin(), MATCH.end(), m_recv_buffer.begin() + OFFSET)) {
            LogDebug(BCLog::NET, "V2 transport error: V1 peer with wrong MessageStart %s\n",
                     HexStr(Span(m_recv_buffer).first(OFFSET)));
            return false;
        }
    }

    if (m_recv_buffer.size() == EllSwiftPubKey::size()) {
        // Other side's key has been fully received, and can now be Diffie-Hellman combined with
        // our key to initialize the encryption ciphers.

        // Initialize the ciphers.
        EllSwiftPubKey ellswift(MakeByteSpan(m_recv_buffer));
        LOCK(m_send_mutex);
        m_cipher.Initialize(ellswift, m_initiating);

        // Switch receiver state to GARB_GARBTERM.
        SetReceiveState(RecvState::GARB_GARBTERM);
        m_recv_buffer.clear();

        // Switch sender state to READY.
        SetSendState(SendState::READY);

        // Append the garbage terminator to the send buffer.
        m_send_buffer.resize(m_send_buffer.size() + BIP324Cipher::GARBAGE_TERMINATOR_LEN);
        std::copy(m_cipher.GetSendGarbageTerminator().begin(),
                  m_cipher.GetSendGarbageTerminator().end(),
                  MakeWritableByteSpan(m_send_buffer).last(BIP324Cipher::GARBAGE_TERMINATOR_LEN).begin());

        // Construct version packet in the send buffer, with the sent garbage data as AAD.
        m_send_buffer.resize(m_send_buffer.size() + BIP324Cipher::EXPANSION + VERSION_CONTENTS.size());
        m_cipher.Encrypt(
            /*contents=*/VERSION_CONTENTS,
            /*aad=*/MakeByteSpan(m_send_garbage),
            /*ignore=*/false,
            /*output=*/MakeWritableByteSpan(m_send_buffer).last(BIP324Cipher::EXPANSION + VERSION_CONTENTS.size()));
        // We no longer need the garbage.
        ClearShrink(m_send_garbage);
    } else {
        // We still have to receive more key bytes.
    }
    return true;
}